

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O2

LY_ERR parse_maxelements(lysp_yang_ctx *ctx,uint32_t *max,uint16_t *flags,lysp_ext_instance **exts)

{
  char cVar1;
  size_t str_len;
  LY_ERR LVar2;
  int iVar3;
  ushort **ppuVar4;
  int *piVar5;
  ulonglong uVar6;
  char *pcVar7;
  char *format;
  ly_ctx *plVar8;
  bool bVar9;
  ly_stmt kw;
  char *word;
  size_t word_len;
  char *buf;
  char *ptr;
  
  buf = (char *)0x0;
  if ((*flags >> 10 & 1) != 0) {
    if (ctx == (lysp_yang_ctx *)0x0) {
      plVar8 = (ly_ctx *)0x0;
    }
    else {
      plVar8 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    ly_vlog(plVar8,(char *)0x0,LYVE_SYNTAX_YANG,"Duplicate keyword \"%s\".","max-elements");
    return LY_EVALID;
  }
  *flags = *flags | 0x400;
  LVar2 = get_argument(ctx,Y_STR_ARG,(uint16_t *)0x0,&word,&buf,&word_len);
  str_len = word_len;
  pcVar7 = word;
  if (LVar2 != LY_SUCCESS) goto LAB_0016f236;
  if (((word_len == 0) || (cVar1 = *word, cVar1 == '0')) ||
     ((cVar1 != 'u' &&
      (ppuVar4 = __ctype_b_loc(), (*(byte *)((long)*ppuVar4 + (long)cVar1 * 2 + 1) & 8) == 0)))) {
    if (ctx == (lysp_yang_ctx *)0x0) {
      plVar8 = (ly_ctx *)0x0;
    }
    else {
      plVar8 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    format = "Invalid value \"%.*s\" of \"%s\".";
    pcVar7 = word;
LAB_0016f22b:
    ly_vlog(plVar8,(char *)0x0,LYVE_SYNTAX_YANG,format,str_len & 0xffffffff,pcVar7,"max-elements");
  }
  else {
    iVar3 = ly_strncmp("unbounded",pcVar7,str_len);
    if (iVar3 != 0) {
      piVar5 = __errno_location();
      *piVar5 = 0;
      uVar6 = strtoull(pcVar7,&ptr,10);
      if ((long)ptr - (long)pcVar7 == str_len) {
        if (uVar6 >> 0x20 == 0 && *piVar5 != 0x22) goto LAB_0016f254;
        if (ctx == (lysp_yang_ctx *)0x0) {
          plVar8 = (ly_ctx *)0x0;
        }
        else {
          plVar8 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        format = "Value \"%.*s\" is out of \"%s\" bounds.";
      }
      else {
        if (ctx == (lysp_yang_ctx *)0x0) {
          plVar8 = (ly_ctx *)0x0;
        }
        else {
          plVar8 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        format = "Invalid value \"%.*s\" of \"%s\".";
      }
      goto LAB_0016f22b;
    }
    uVar6 = 0;
LAB_0016f254:
    *max = (uint32_t)uVar6;
    LVar2 = get_keyword(ctx,&kw,&word,&word_len);
    if (LVar2 != LY_SUCCESS) goto LAB_0016f236;
    if (kw == LY_STMT_SYNTAX_SEMICOLON) {
      bVar9 = true;
LAB_0016f2f5:
      while (LVar2 = LY_SUCCESS, !bVar9) {
        if (kw != LY_STMT_EXTENSION_INSTANCE) {
          if (ctx == (lysp_yang_ctx *)0x0) {
            plVar8 = (ly_ctx *)0x0;
          }
          else {
            plVar8 = (ly_ctx *)
                     **(undefined8 **)
                       (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
          }
          pcVar7 = lyplg_ext_stmt2str(kw);
          ly_vlog(plVar8,(char *)0x0,LYVE_SYNTAX_YANG,"Invalid keyword \"%s\" as a child of \"%s\"."
                  ,pcVar7,"max-elements");
          goto LAB_0016f232;
        }
        LVar2 = parse_ext(ctx,word,word_len,max,LY_STMT_MAX_ELEMENTS,0,exts);
        if ((LVar2 != LY_SUCCESS) ||
           (LVar2 = get_keyword(ctx,&kw,&word,&word_len), LVar2 != LY_SUCCESS)) break;
        bVar9 = kw == LY_STMT_SYNTAX_RIGHT_BRACE;
      }
      goto LAB_0016f236;
    }
    if (kw == LY_STMT_SYNTAX_LEFT_BRACE) {
      LVar2 = get_keyword(ctx,&kw,&word,&word_len);
      if (LVar2 != LY_SUCCESS) goto LAB_0016f236;
      bVar9 = kw == LY_STMT_SYNTAX_RIGHT_BRACE;
      goto LAB_0016f2f5;
    }
    if (ctx == (lysp_yang_ctx *)0x0) {
      plVar8 = (ly_ctx *)0x0;
    }
    else {
      plVar8 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    pcVar7 = lyplg_ext_stmt2str(kw);
    ly_vlog(plVar8,(char *)0x0,LYVE_SYNTAX_YANG,"Invalid keyword \"%s\", expected \";\" or \"{\".",
            pcVar7);
  }
LAB_0016f232:
  LVar2 = LY_EVALID;
LAB_0016f236:
  free(buf);
  return LVar2;
}

Assistant:

LY_ERR
parse_maxelements(struct lysp_yang_ctx *ctx, uint32_t *max, uint16_t *flags, struct lysp_ext_instance **exts)
{
    LY_ERR ret = LY_SUCCESS;
    char *buf = NULL, *word, *ptr;
    size_t word_len;
    unsigned long long num;
    enum ly_stmt kw;

    if (*flags & LYS_SET_MAX) {
        LOGVAL_PARSER(ctx, LY_VCODE_DUPSTMT, "max-elements");
        return LY_EVALID;
    }
    *flags |= LYS_SET_MAX;

    /* get value */
    LY_CHECK_GOTO(ret = get_argument(ctx, Y_STR_ARG, NULL, &word, &buf, &word_len), cleanup);

    if (!word_len || (word[0] == '0') || ((word[0] != 'u') && !isdigit(word[0]))) {
        LOGVAL_PARSER(ctx, LY_VCODE_INVAL, (int)word_len, word, "max-elements");
        ret = LY_EVALID;
        goto cleanup;
    }

    if (ly_strncmp("unbounded", word, word_len)) {
        errno = 0;
        num = strtoull(word, &ptr, LY_BASE_DEC);
        /* we have not parsed the whole argument */
        if ((size_t)(ptr - word) != word_len) {
            LOGVAL_PARSER(ctx, LY_VCODE_INVAL, (int)word_len, word, "max-elements");
            ret = LY_EVALID;
            goto cleanup;
        }
        if ((errno == ERANGE) || (num > UINT32_MAX)) {
            LOGVAL_PARSER(ctx, LY_VCODE_OOB, (int)word_len, word, "max-elements");
            ret = LY_EVALID;
            goto cleanup;
        }

        *max = num;
    } else {
        /* unbounded */
        *max = 0;
    }

    YANG_READ_SUBSTMT_FOR_GOTO(ctx, kw, word, word_len, ret, cleanup) {
        switch (kw) {
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_GOTO(ret = parse_ext(ctx, word, word_len, max, LY_STMT_MAX_ELEMENTS, 0, exts), cleanup);
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(kw), "max-elements");
            ret = LY_EVALID;
            goto cleanup;
        }
        YANG_READ_SUBSTMT_NEXT_ITER(ctx, kw, word, word_len, NULL, ret, cleanup);
    }

cleanup:
    free(buf);
    return ret;
}